

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Scene *pSVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  RayQueryContext *pRVar16;
  undefined8 uVar17;
  uint uVar18;
  Scene *pSVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  RayQueryContext *pRVar23;
  size_t sVar24;
  ulong uVar25;
  float fVar37;
  float fVar38;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar39;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  vint4 bi;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar56;
  float fVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar69;
  float fVar70;
  vint4 ai_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar71;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 bi_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  vint4 ai;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  vint4 ai_1;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar97 [16];
  int iVar98;
  float fVar99;
  int iVar100;
  float fVar101;
  int iVar102;
  float fVar103;
  int iVar104;
  float fVar105;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  Intersectors *local_1088;
  size_t local_1080;
  Precalculations *local_1078;
  RayHitK<4> *local_1070;
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  
  local_1078 = pre;
  local_1088 = This;
  pRVar23 = (RayQueryContext *)(local_f78 + 0x10);
  local_f78._0_8_ = root.ptr;
  local_f78._8_4_ = 0;
  local_1028 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_10a8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1098 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  local_ff8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  local_1008 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  local_1038 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1048 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1068 = (tray->tnear).field_0.i[k];
  iVar40 = (tray->tfar).field_0.i[k];
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_10a4 = local_10a8;
  fStack_10a0 = local_10a8;
  fStack_109c = local_10a8;
  fStack_1094 = local_1098;
  fStack_1090 = local_1098;
  fStack_108c = local_1098;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  iStack_1064 = local_1068;
  iStack_1060 = local_1068;
  iStack_105c = local_1068;
  local_1070 = ray;
  local_1080 = k;
  sVar24 = k;
  iVar41 = iVar40;
  iVar42 = iVar40;
  iVar43 = iVar40;
  fVar87 = local_1038;
  fVar88 = local_1038;
  fVar89 = local_1038;
  fVar90 = local_1038;
  fVar69 = local_1048;
  fVar37 = local_1048;
  fVar95 = local_1048;
  fVar70 = local_1048;
  fVar38 = local_1058;
  fVar96 = local_1058;
  fVar71 = local_1058;
  fVar39 = local_1058;
  fVar48 = local_1028;
  fVar49 = local_1028;
  fVar56 = local_1028;
  fVar57 = local_1028;
  fVar58 = local_10a8;
  fVar59 = local_10a8;
  fVar60 = local_10a8;
  fVar61 = local_10a8;
  fVar82 = local_1098;
  fVar83 = local_1098;
  fVar84 = local_1098;
  fVar85 = local_1098;
  iVar98 = local_1068;
  iVar100 = local_1068;
  iVar102 = local_1068;
  iVar104 = local_1068;
LAB_00721d50:
  do {
    do {
      if (pRVar23 == (RayQueryContext *)local_f78) {
        return;
      }
      pRVar16 = pRVar23 + -1;
      pRVar23 = (RayQueryContext *)&pRVar23[-1].user;
    } while (*(float *)(ray + sVar24 * 4 + 0x80) <= *(float *)&pRVar16->args &&
             *(float *)&pRVar16->args != *(float *)(ray + sVar24 * 4 + 0x80));
    pSVar19 = *(Scene **)pRVar23;
    while (((ulong)pSVar19 & 8) == 0) {
      fVar5 = *(float *)(ray + sVar24 * 4 + 0x70);
      uVar18 = (uint)pSVar19 & 7;
      uVar22 = (ulong)pSVar19 & 0xfffffffffffffff0;
      if (uVar18 == 3) {
        local_fa8 = *(float *)(uVar22 + 0x20);
        fStack_fa4 = *(float *)(uVar22 + 0x24);
        fStack_fa0 = *(float *)(uVar22 + 0x28);
        fStack_f9c = *(float *)(uVar22 + 0x2c);
        local_fb8 = *(float *)(uVar22 + 0x30);
        fStack_fb4 = *(float *)(uVar22 + 0x34);
        fStack_fb0 = *(float *)(uVar22 + 0x38);
        fStack_fac = *(float *)(uVar22 + 0x3c);
        local_fd8 = *(float *)(uVar22 + 0x50);
        fStack_fd4 = *(float *)(uVar22 + 0x54);
        fStack_fd0 = *(float *)(uVar22 + 0x58);
        fStack_fcc = *(float *)(uVar22 + 0x5c);
        local_fc8 = *(float *)(uVar22 + 0x60);
        fStack_fc4 = *(float *)(uVar22 + 100);
        fStack_fc0 = *(float *)(uVar22 + 0x68);
        fStack_fbc = *(float *)(uVar22 + 0x6c);
        local_1018 = *(undefined8 *)(uVar22 + 0xa0);
        uStack_1010 = *(undefined8 *)(uVar22 + 0xa8);
        uVar10 = local_1018;
        uVar17 = uStack_1010;
        fVar82 = 1.0 - fVar5;
        fVar83 = fVar82 * 0.0;
        local_f98 = *(float *)(uVar22 + 0xe0) * fVar5 + fVar83;
        fStack_f94 = *(float *)(uVar22 + 0xe4) * fVar5 + fVar83;
        fStack_f90 = *(float *)(uVar22 + 0xe8) * fVar5 + fVar83;
        fStack_f8c = *(float *)(uVar22 + 0xec) * fVar5 + fVar83;
        local_f88 = *(float *)(uVar22 + 0xf0) * fVar5 + fVar83;
        fStack_f84 = *(float *)(uVar22 + 0xf4) * fVar5 + fVar83;
        fStack_f80 = *(float *)(uVar22 + 0xf8) * fVar5 + fVar83;
        fStack_f7c = *(float *)(uVar22 + 0xfc) * fVar5 + fVar83;
        auVar66._0_4_ =
             local_fe8 * local_fa8 + local_ff8 * local_fd8 + local_1008 * *(float *)(uVar22 + 0x80);
        auVar66._4_4_ =
             fStack_fe4 * fStack_fa4 +
             fStack_ff4 * fStack_fd4 + fStack_1004 * *(float *)(uVar22 + 0x84);
        auVar66._8_4_ =
             fStack_fe0 * fStack_fa0 +
             fStack_ff0 * fStack_fd0 + fStack_1000 * *(float *)(uVar22 + 0x88);
        auVar66._12_4_ =
             fStack_fdc * fStack_f9c +
             fStack_fec * fStack_fcc + fStack_ffc * *(float *)(uVar22 + 0x8c);
        auVar73._0_4_ =
             local_fe8 * local_fb8 + local_ff8 * local_fc8 + local_1008 * *(float *)(uVar22 + 0x90);
        auVar73._4_4_ =
             fStack_fe4 * fStack_fb4 +
             fStack_ff4 * fStack_fc4 + fStack_1004 * *(float *)(uVar22 + 0x94);
        auVar73._8_4_ =
             fStack_fe0 * fStack_fb0 +
             fStack_ff0 * fStack_fc0 + fStack_1000 * *(float *)(uVar22 + 0x98);
        auVar73._12_4_ =
             fStack_fdc * fStack_fac +
             fStack_fec * fStack_fbc + fStack_ffc * *(float *)(uVar22 + 0x9c);
        fVar87 = (float)DAT_01f4bd50;
        fVar88 = DAT_01f4bd50._4_4_;
        fVar89 = DAT_01f4bd50._8_4_;
        fVar90 = DAT_01f4bd50._12_4_;
        auVar65._4_4_ = -(uint)(ABS(auVar66._4_4_) < fVar88);
        auVar65._0_4_ = -(uint)(ABS(auVar66._0_4_) < fVar87);
        auVar65._8_4_ = -(uint)(ABS(auVar66._8_4_) < fVar89);
        auVar65._12_4_ = -(uint)(ABS(auVar66._12_4_) < fVar90);
        auVar81 = blendvps(auVar66,_DAT_01f4bd50,auVar65);
        auVar78._4_4_ = -(uint)(ABS(auVar73._4_4_) < fVar88);
        auVar78._0_4_ = -(uint)(ABS(auVar73._0_4_) < fVar87);
        auVar78._8_4_ = -(uint)(ABS(auVar73._8_4_) < fVar89);
        auVar78._12_4_ = -(uint)(ABS(auVar73._12_4_) < fVar90);
        auVar78 = blendvps(auVar73,_DAT_01f4bd50,auVar78);
        local_1018._4_4_ = (float)((ulong)local_1018 >> 0x20);
        uStack_1010._4_4_ = (float)((ulong)uStack_1010 >> 0x20);
        local_10c8 = (float)*(undefined8 *)(uVar22 + 0x70);
        fStack_10c4 = (float)((ulong)*(undefined8 *)(uVar22 + 0x70) >> 0x20);
        fStack_10c0 = (float)*(undefined8 *)(uVar22 + 0x78);
        fStack_10bc = (float)((ulong)*(undefined8 *)(uVar22 + 0x78) >> 0x20);
        auVar52._0_4_ =
             local_fe8 * *(float *)(uVar22 + 0x40) +
             local_ff8 * local_10c8 + local_1008 * (float)local_1018;
        auVar52._4_4_ =
             fStack_fe4 * *(float *)(uVar22 + 0x44) +
             fStack_ff4 * fStack_10c4 + fStack_1004 * local_1018._4_4_;
        auVar52._8_4_ =
             fStack_fe0 * *(float *)(uVar22 + 0x48) +
             fStack_ff0 * fStack_10c0 + fStack_1000 * (float)uStack_1010;
        auVar52._12_4_ =
             fStack_fdc * *(float *)(uVar22 + 0x4c) +
             fStack_fec * fStack_10bc + fStack_ffc * uStack_1010._4_4_;
        auVar76._4_4_ = -(uint)(ABS(auVar52._4_4_) < fVar88);
        auVar76._0_4_ = -(uint)(ABS(auVar52._0_4_) < fVar87);
        auVar76._8_4_ = -(uint)(ABS(auVar52._8_4_) < fVar89);
        auVar76._12_4_ = -(uint)(ABS(auVar52._12_4_) < fVar90);
        auVar65 = blendvps(auVar52,_DAT_01f4bd50,auVar76);
        auVar51 = rcpps(auVar76,auVar81);
        fVar87 = auVar51._0_4_;
        fVar90 = auVar51._4_4_;
        fVar95 = auVar51._8_4_;
        fVar96 = auVar51._12_4_;
        fVar87 = (1.0 - auVar81._0_4_ * fVar87) * fVar87 + fVar87;
        fVar90 = (1.0 - auVar81._4_4_ * fVar90) * fVar90 + fVar90;
        fVar95 = (1.0 - auVar81._8_4_ * fVar95) * fVar95 + fVar95;
        fVar96 = (1.0 - auVar81._12_4_ * fVar96) * fVar96 + fVar96;
        auVar51 = rcpps(auVar51,auVar78);
        fVar88 = auVar51._0_4_;
        auVar74._0_4_ = auVar78._0_4_ * fVar88;
        fVar69 = auVar51._4_4_;
        auVar74._4_4_ = auVar78._4_4_ * fVar69;
        fVar70 = auVar51._8_4_;
        auVar74._8_4_ = auVar78._8_4_ * fVar70;
        fVar71 = auVar51._12_4_;
        auVar74._12_4_ = auVar78._12_4_ * fVar71;
        fVar88 = (1.0 - auVar74._0_4_) * fVar88 + fVar88;
        fVar69 = (1.0 - auVar74._4_4_) * fVar69 + fVar69;
        fVar70 = (1.0 - auVar74._8_4_) * fVar70 + fVar70;
        fVar71 = (1.0 - auVar74._12_4_) * fVar71 + fVar71;
        auVar51 = rcpps(auVar74,auVar65);
        fVar89 = auVar51._0_4_;
        fVar37 = auVar51._4_4_;
        fVar38 = auVar51._8_4_;
        fVar39 = auVar51._12_4_;
        fVar89 = (1.0 - auVar65._0_4_ * fVar89) * fVar89 + fVar89;
        fVar37 = (1.0 - auVar65._4_4_ * fVar37) * fVar37 + fVar37;
        fVar38 = (1.0 - auVar65._8_4_ * fVar38) * fVar38 + fVar38;
        fVar39 = (1.0 - auVar65._12_4_ * fVar39) * fVar39 + fVar39;
        fVar48 = local_fa8 * local_1028 +
                 local_fd8 * local_10a8 +
                 *(float *)(uVar22 + 0x80) * local_1098 + *(float *)(uVar22 + 0xb0);
        fVar56 = fStack_fa4 * fStack_1024 +
                 fStack_fd4 * fStack_10a4 +
                 *(float *)(uVar22 + 0x84) * fStack_1094 + *(float *)(uVar22 + 0xb4);
        fVar58 = fStack_fa0 * fStack_1020 +
                 fStack_fd0 * fStack_10a0 +
                 *(float *)(uVar22 + 0x88) * fStack_1090 + *(float *)(uVar22 + 0xb8);
        fVar60 = fStack_f9c * fStack_101c +
                 fStack_fcc * fStack_109c +
                 *(float *)(uVar22 + 0x8c) * fStack_108c + *(float *)(uVar22 + 0xbc);
        fVar49 = local_fb8 * local_1028 +
                 local_fc8 * local_10a8 +
                 *(float *)(uVar22 + 0x90) * local_1098 + *(float *)(uVar22 + 0xc0);
        fVar57 = fStack_fb4 * fStack_1024 +
                 fStack_fc4 * fStack_10a4 +
                 *(float *)(uVar22 + 0x94) * fStack_1094 + *(float *)(uVar22 + 0xc4);
        fVar59 = fStack_fb0 * fStack_1020 +
                 fStack_fc0 * fStack_10a0 +
                 *(float *)(uVar22 + 0x98) * fStack_1090 + *(float *)(uVar22 + 200);
        fVar61 = fStack_fac * fStack_101c +
                 fStack_fbc * fStack_109c +
                 *(float *)(uVar22 + 0x9c) * fStack_108c + *(float *)(uVar22 + 0xcc);
        fVar99 = *(float *)(uVar22 + 0x40) * local_1028 +
                 local_10c8 * local_10a8 +
                 (float)local_1018 * local_1098 + *(float *)(uVar22 + 0xd0);
        fVar101 = *(float *)(uVar22 + 0x44) * fStack_1024 +
                  fStack_10c4 * fStack_10a4 +
                  local_1018._4_4_ * fStack_1094 + *(float *)(uVar22 + 0xd4);
        fVar103 = *(float *)(uVar22 + 0x48) * fStack_1020 +
                  fStack_10c0 * fStack_10a0 +
                  (float)uStack_1010 * fStack_1090 + *(float *)(uVar22 + 0xd8);
        fVar105 = *(float *)(uVar22 + 0x4c) * fStack_101c +
                  fStack_10bc * fStack_109c +
                  uStack_1010._4_4_ * fStack_108c + *(float *)(uVar22 + 0xdc);
        auVar51._4_4_ = iStack_1064;
        auVar51._0_4_ = local_1068;
        auVar51._8_4_ = iStack_1060;
        auVar51._12_4_ = iStack_105c;
        fVar91 = (local_f98 - fVar48) * fVar87;
        fVar92 = (fStack_f94 - fVar56) * fVar90;
        fVar93 = (fStack_f90 - fVar58) * fVar95;
        fVar94 = (fStack_f8c - fVar60) * fVar96;
        fVar87 = ((*(float *)(uVar22 + 0x110) * fVar5 + fVar82) - fVar48) * fVar87;
        fVar90 = ((*(float *)(uVar22 + 0x114) * fVar5 + fVar82) - fVar56) * fVar90;
        fVar95 = ((*(float *)(uVar22 + 0x118) * fVar5 + fVar82) - fVar58) * fVar95;
        fVar96 = ((*(float *)(uVar22 + 0x11c) * fVar5 + fVar82) - fVar60) * fVar96;
        fVar48 = (local_f88 - fVar49) * fVar88;
        fVar56 = (fStack_f84 - fVar57) * fVar69;
        fVar58 = (fStack_f80 - fVar59) * fVar70;
        fVar60 = (fStack_f7c - fVar61) * fVar71;
        fVar84 = ((fVar83 + *(float *)(uVar22 + 0x100) * fVar5) - fVar99) * fVar89;
        fVar85 = ((fVar83 + *(float *)(uVar22 + 0x104) * fVar5) - fVar101) * fVar37;
        fVar86 = ((fVar83 + *(float *)(uVar22 + 0x108) * fVar5) - fVar103) * fVar38;
        fVar83 = ((fVar83 + *(float *)(uVar22 + 0x10c) * fVar5) - fVar105) * fVar39;
        fVar88 = ((*(float *)(uVar22 + 0x120) * fVar5 + fVar82) - fVar49) * fVar88;
        fVar69 = ((*(float *)(uVar22 + 0x124) * fVar5 + fVar82) - fVar57) * fVar69;
        fVar70 = ((*(float *)(uVar22 + 0x128) * fVar5 + fVar82) - fVar59) * fVar70;
        fVar71 = ((*(float *)(uVar22 + 300) * fVar5 + fVar82) - fVar61) * fVar71;
        fVar89 = ((fVar5 * *(float *)(uVar22 + 0x130) + fVar82) - fVar99) * fVar89;
        fVar37 = ((fVar5 * *(float *)(uVar22 + 0x134) + fVar82) - fVar101) * fVar37;
        fVar38 = ((fVar5 * *(float *)(uVar22 + 0x138) + fVar82) - fVar103) * fVar38;
        fVar39 = ((fVar5 * *(float *)(uVar22 + 0x13c) + fVar82) - fVar105) * fVar39;
        auVar81._0_4_ =
             (uint)((int)fVar88 < (int)fVar48) * (int)fVar88 |
             (uint)((int)fVar88 >= (int)fVar48) * (int)fVar48;
        auVar81._4_4_ =
             (uint)((int)fVar69 < (int)fVar56) * (int)fVar69 |
             (uint)((int)fVar69 >= (int)fVar56) * (int)fVar56;
        auVar81._8_4_ =
             (uint)((int)fVar70 < (int)fVar58) * (int)fVar70 |
             (uint)((int)fVar70 >= (int)fVar58) * (int)fVar58;
        auVar81._12_4_ =
             (uint)((int)fVar71 < (int)fVar60) * (int)fVar71 |
             (uint)((int)fVar71 >= (int)fVar60) * (int)fVar60;
        auVar53._0_4_ =
             (uint)((int)fVar89 < (int)fVar84) * (int)fVar89 |
             (uint)((int)fVar89 >= (int)fVar84) * (int)fVar84;
        auVar53._4_4_ =
             (uint)((int)fVar37 < (int)fVar85) * (int)fVar37 |
             (uint)((int)fVar37 >= (int)fVar85) * (int)fVar85;
        auVar53._8_4_ =
             (uint)((int)fVar38 < (int)fVar86) * (int)fVar38 |
             (uint)((int)fVar38 >= (int)fVar86) * (int)fVar86;
        auVar53._12_4_ =
             (uint)((int)fVar39 < (int)fVar83) * (int)fVar39 |
             (uint)((int)fVar39 >= (int)fVar83) * (int)fVar83;
        auVar65 = maxps(auVar81,auVar53);
        auVar54._0_4_ =
             (uint)((int)fVar87 < (int)fVar91) * (int)fVar87 |
             (uint)((int)fVar87 >= (int)fVar91) * (int)fVar91;
        auVar54._4_4_ =
             (uint)((int)fVar90 < (int)fVar92) * (int)fVar90 |
             (uint)((int)fVar90 >= (int)fVar92) * (int)fVar92;
        auVar54._8_4_ =
             (uint)((int)fVar95 < (int)fVar93) * (int)fVar95 |
             (uint)((int)fVar95 >= (int)fVar93) * (int)fVar93;
        auVar54._12_4_ =
             (uint)((int)fVar96 < (int)fVar94) * (int)fVar96 |
             (uint)((int)fVar96 >= (int)fVar94) * (int)fVar94;
        auVar79._0_4_ =
             (uint)((int)fVar87 < (int)fVar91) * (int)fVar91 |
             (uint)((int)fVar87 >= (int)fVar91) * (int)fVar87;
        auVar79._4_4_ =
             (uint)((int)fVar90 < (int)fVar92) * (int)fVar92 |
             (uint)((int)fVar90 >= (int)fVar92) * (int)fVar90;
        auVar79._8_4_ =
             (uint)((int)fVar95 < (int)fVar93) * (int)fVar93 |
             (uint)((int)fVar95 >= (int)fVar93) * (int)fVar95;
        auVar79._12_4_ =
             (uint)((int)fVar96 < (int)fVar94) * (int)fVar94 |
             (uint)((int)fVar96 >= (int)fVar94) * (int)fVar96;
        auVar97._0_4_ =
             (uint)((int)fVar88 < (int)fVar48) * (int)fVar48 |
             (uint)((int)fVar88 >= (int)fVar48) * (int)fVar88;
        auVar97._4_4_ =
             (uint)((int)fVar69 < (int)fVar56) * (int)fVar56 |
             (uint)((int)fVar69 >= (int)fVar56) * (int)fVar69;
        auVar97._8_4_ =
             (uint)((int)fVar70 < (int)fVar58) * (int)fVar58 |
             (uint)((int)fVar70 >= (int)fVar58) * (int)fVar70;
        auVar97._12_4_ =
             (uint)((int)fVar71 < (int)fVar60) * (int)fVar60 |
             (uint)((int)fVar71 >= (int)fVar60) * (int)fVar71;
        auVar45._0_4_ =
             (uint)((int)fVar89 < (int)fVar84) * (int)fVar84 |
             (uint)((int)fVar89 >= (int)fVar84) * (int)fVar89;
        auVar45._4_4_ =
             (uint)((int)fVar37 < (int)fVar85) * (int)fVar85 |
             (uint)((int)fVar37 >= (int)fVar85) * (int)fVar37;
        auVar45._8_4_ =
             (uint)((int)fVar38 < (int)fVar86) * (int)fVar86 |
             (uint)((int)fVar38 >= (int)fVar86) * (int)fVar38;
        auVar45._12_4_ =
             (uint)((int)fVar39 < (int)fVar83) * (int)fVar83 |
             (uint)((int)fVar39 >= (int)fVar83) * (int)fVar39;
        auVar78 = minps(auVar97,auVar45);
        auVar51 = maxps(auVar51,auVar54);
        local_10b8 = maxps(auVar51,auVar65);
        auVar28._4_4_ = iVar41;
        auVar28._0_4_ = iVar40;
        auVar28._8_4_ = iVar42;
        auVar28._12_4_ = iVar43;
        auVar51 = minps(auVar28,auVar79);
        auVar51 = minps(auVar51,auVar78);
        auVar46._4_4_ = -(uint)(local_10b8._4_4_ <= auVar51._4_4_);
        auVar46._0_4_ = -(uint)(local_10b8._0_4_ <= auVar51._0_4_);
        auVar46._8_4_ = -(uint)(local_10b8._8_4_ <= auVar51._8_4_);
        auVar46._12_4_ = -(uint)(local_10b8._12_4_ <= auVar51._12_4_);
        uVar18 = movmskps((int)k,auVar46);
        fVar87 = local_1038;
        fVar88 = fStack_1034;
        fVar89 = fStack_1030;
        fVar90 = fStack_102c;
        fVar69 = local_1048;
        fVar37 = fStack_1044;
        fVar95 = fStack_1040;
        fVar70 = fStack_103c;
        fVar38 = local_1058;
        fVar96 = fStack_1054;
        fVar71 = fStack_1050;
        fVar39 = fStack_104c;
        fVar48 = local_1028;
        fVar49 = fStack_1024;
        fVar56 = fStack_1020;
        fVar57 = fStack_101c;
        fVar58 = local_10a8;
        fVar59 = fStack_10a4;
        fVar60 = fStack_10a0;
        fVar61 = fStack_109c;
        fVar82 = local_1098;
        fVar83 = fStack_1094;
        fVar84 = fStack_1090;
        fVar85 = fStack_108c;
        iVar98 = local_1068;
        iVar100 = iStack_1064;
        iVar102 = iStack_1060;
        iVar104 = iStack_105c;
        local_1018 = uVar10;
        uStack_1010 = uVar17;
      }
      else {
        pfVar3 = (float *)(uVar22 + 0x80 + uVar20);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar20);
        pfVar4 = (float *)(uVar22 + 0x80 + uVar25);
        pfVar2 = (float *)(uVar22 + 0x20 + uVar25);
        auVar26._0_4_ = ((*pfVar3 * fVar5 + *pfVar1) - fVar48) * fVar87;
        auVar26._4_4_ = ((pfVar3[1] * fVar5 + pfVar1[1]) - fVar49) * fVar88;
        auVar26._8_4_ = ((pfVar3[2] * fVar5 + pfVar1[2]) - fVar56) * fVar89;
        auVar26._12_4_ = ((pfVar3[3] * fVar5 + pfVar1[3]) - fVar57) * fVar90;
        auVar50._0_4_ = ((*pfVar4 * fVar5 + *pfVar2) - fVar58) * fVar69;
        auVar50._4_4_ = ((pfVar4[1] * fVar5 + pfVar2[1]) - fVar59) * fVar37;
        auVar50._8_4_ = ((pfVar4[2] * fVar5 + pfVar2[2]) - fVar60) * fVar95;
        auVar50._12_4_ = ((pfVar4[3] * fVar5 + pfVar2[3]) - fVar61) * fVar70;
        pfVar2 = (float *)(uVar22 + 0x80 + uVar21);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar21);
        auVar62._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar82) * fVar38;
        auVar62._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar83) * fVar96;
        auVar62._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar84) * fVar71;
        auVar62._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar85) * fVar39;
        auVar51 = maxps(auVar50,auVar62);
        pfVar2 = (float *)(uVar22 + 0x80 + (uVar20 ^ 0x10));
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar20 ^ 0x10));
        auVar72._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar48) * fVar87;
        auVar72._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar49) * fVar88;
        auVar72._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar56) * fVar89;
        auVar72._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar57) * fVar90;
        pfVar2 = (float *)(uVar22 + 0x80 + (uVar25 ^ 0x10));
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
        auVar77._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar58) * fVar69;
        auVar77._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar59) * fVar37;
        auVar77._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar60) * fVar95;
        auVar77._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar61) * fVar70;
        pfVar2 = (float *)(uVar22 + 0x80 + (uVar21 ^ 0x10));
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar21 ^ 0x10));
        auVar63._0_4_ = ((*pfVar2 * fVar5 + *pfVar1) - fVar82) * fVar38;
        auVar63._4_4_ = ((pfVar2[1] * fVar5 + pfVar1[1]) - fVar83) * fVar96;
        auVar63._8_4_ = ((pfVar2[2] * fVar5 + pfVar1[2]) - fVar84) * fVar71;
        auVar63._12_4_ = ((pfVar2[3] * fVar5 + pfVar1[3]) - fVar85) * fVar39;
        auVar78 = minps(auVar77,auVar63);
        auVar64._4_4_ = iVar100;
        auVar64._0_4_ = iVar98;
        auVar64._8_4_ = iVar102;
        auVar64._12_4_ = iVar104;
        auVar65 = maxps(auVar64,auVar26);
        local_10b8 = maxps(auVar65,auVar51);
        auVar27._4_4_ = iVar41;
        auVar27._0_4_ = iVar40;
        auVar27._8_4_ = iVar42;
        auVar27._12_4_ = iVar43;
        auVar51 = minps(auVar27,auVar72);
        auVar51 = minps(auVar51,auVar78);
        if (uVar18 == 6) {
          bVar12 = (fVar5 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar5) &&
                   local_10b8._0_4_ <= auVar51._0_4_;
          bVar13 = (fVar5 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar5) &&
                   local_10b8._4_4_ <= auVar51._4_4_;
          bVar14 = (fVar5 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar5) &&
                   local_10b8._8_4_ <= auVar51._8_4_;
          bVar15 = (fVar5 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar5) &&
                   local_10b8._12_4_ <= auVar51._12_4_;
        }
        else {
          bVar12 = local_10b8._0_4_ <= auVar51._0_4_;
          bVar13 = local_10b8._4_4_ <= auVar51._4_4_;
          bVar14 = local_10b8._8_4_ <= auVar51._8_4_;
          bVar15 = local_10b8._12_4_ <= auVar51._12_4_;
        }
        auVar44._0_4_ = (uint)bVar12 * -0x80000000;
        auVar44._4_4_ = (uint)bVar13 * -0x80000000;
        auVar44._8_4_ = (uint)bVar14 * -0x80000000;
        auVar44._12_4_ = (uint)bVar15 * -0x80000000;
        uVar18 = movmskps((int)k,auVar44);
      }
      k = CONCAT44((int)(k >> 0x20),uVar18);
      if ((RayQueryContext *)k == (RayQueryContext *)0x0) goto LAB_00721d50;
      lVar11 = 0;
      if ((RayQueryContext *)k != (RayQueryContext *)0x0) {
        for (; (k >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      pSVar19 = *(Scene **)(uVar22 + lVar11 * 8);
      uVar18 = uVar18 - 1 & uVar18;
      k = (size_t)pRVar23;
      if (uVar18 != 0) {
        uVar6 = *(uint *)(local_10b8 + lVar11 * 4);
        lVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        pSVar9 = *(Scene **)(uVar22 + lVar11 * 8);
        uVar7 = *(uint *)(local_10b8 + lVar11 * 4);
        uVar18 = uVar18 - 1 & uVar18;
        if (uVar18 == 0) {
          k = (size_t)&pRVar23->args;
          if (uVar6 < uVar7) {
            pRVar23->scene = pSVar9;
            *(uint *)&pRVar23->user = uVar7;
            pRVar23 = (RayQueryContext *)k;
          }
          else {
            pRVar23->scene = pSVar19;
            *(uint *)&pRVar23->user = uVar6;
            pSVar19 = pSVar9;
            pRVar23 = (RayQueryContext *)k;
          }
        }
        else {
          auVar47._8_4_ = uVar6;
          auVar47._0_8_ = pSVar19;
          auVar47._12_4_ = 0;
          auVar67._8_4_ = uVar7;
          auVar67._0_8_ = pSVar9;
          auVar67._12_4_ = 0;
          lVar11 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar10 = *(undefined8 *)(uVar22 + lVar11 * 8);
          iVar8 = *(int *)(local_10b8 + lVar11 * 4);
          auVar55._8_4_ = iVar8;
          auVar55._0_8_ = uVar10;
          auVar55._12_4_ = 0;
          auVar29._8_4_ = -(uint)((int)uVar6 < (int)uVar7);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 == 0) {
            auVar29._4_4_ = auVar29._8_4_;
            auVar29._0_4_ = auVar29._8_4_;
            auVar29._12_4_ = auVar29._8_4_;
            auVar75._8_4_ = uVar7;
            auVar75._0_8_ = pSVar9;
            auVar75._12_4_ = 0;
            auVar65 = blendvps(auVar75,auVar47,auVar29);
            auVar51 = blendvps(auVar47,auVar67,auVar29);
            auVar30._8_4_ = -(uint)(auVar65._8_4_ < iVar8);
            auVar30._4_4_ = auVar30._8_4_;
            auVar30._0_4_ = auVar30._8_4_;
            auVar30._12_4_ = auVar30._8_4_;
            auVar68._8_4_ = iVar8;
            auVar68._0_8_ = uVar10;
            auVar68._12_4_ = 0;
            auVar78 = blendvps(auVar68,auVar65,auVar30);
            auVar76 = blendvps(auVar65,auVar55,auVar30);
            auVar31._8_4_ = -(uint)(auVar51._8_4_ < auVar76._8_4_);
            auVar31._4_4_ = auVar31._8_4_;
            auVar31._0_4_ = auVar31._8_4_;
            auVar31._12_4_ = auVar31._8_4_;
            auVar65 = blendvps(auVar76,auVar51,auVar31);
            auVar51 = blendvps(auVar51,auVar76,auVar31);
            pRVar23->scene = (Scene *)auVar51._0_8_;
            pRVar23->user = (RTCRayQueryContext *)auVar51._8_8_;
            *(undefined1 (*) [16])&pRVar23->args = auVar65;
            pSVar19 = auVar78._0_8_;
            pRVar23 = (RayQueryContext *)&pRVar23[1].user;
            k = (size_t)pRVar23;
          }
          else {
            lVar11 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            auVar32._4_4_ = auVar29._8_4_;
            auVar32._0_4_ = auVar29._8_4_;
            auVar32._8_4_ = auVar29._8_4_;
            auVar32._12_4_ = auVar29._8_4_;
            auVar76 = blendvps(auVar67,auVar47,auVar32);
            auVar51 = blendvps(auVar47,auVar67,auVar32);
            auVar80._8_4_ = *(int *)(local_10b8 + lVar11 * 4);
            auVar80._0_8_ = *(undefined8 *)(uVar22 + lVar11 * 8);
            auVar80._12_4_ = 0;
            auVar33._8_4_ = -(uint)(iVar8 < *(int *)(local_10b8 + lVar11 * 4));
            auVar33._4_4_ = auVar33._8_4_;
            auVar33._0_4_ = auVar33._8_4_;
            auVar33._12_4_ = auVar33._8_4_;
            auVar78 = blendvps(auVar80,auVar55,auVar33);
            auVar65 = blendvps(auVar55,auVar80,auVar33);
            auVar34._8_4_ = -(uint)(auVar51._8_4_ < auVar65._8_4_);
            auVar34._4_4_ = auVar34._8_4_;
            auVar34._0_4_ = auVar34._8_4_;
            auVar34._12_4_ = auVar34._8_4_;
            auVar81 = blendvps(auVar65,auVar51,auVar34);
            auVar51 = blendvps(auVar51,auVar65,auVar34);
            auVar35._8_4_ = -(uint)(auVar76._8_4_ < auVar78._8_4_);
            auVar35._4_4_ = auVar35._8_4_;
            auVar35._0_4_ = auVar35._8_4_;
            auVar35._12_4_ = auVar35._8_4_;
            auVar65 = blendvps(auVar78,auVar76,auVar35);
            auVar76 = blendvps(auVar76,auVar78,auVar35);
            auVar36._8_4_ = -(uint)(auVar76._8_4_ < auVar81._8_4_);
            auVar36._4_4_ = auVar36._8_4_;
            auVar36._0_4_ = auVar36._8_4_;
            auVar36._12_4_ = auVar36._8_4_;
            auVar78 = blendvps(auVar81,auVar76,auVar36);
            auVar76 = blendvps(auVar76,auVar81,auVar36);
            pRVar23->scene = (Scene *)auVar51._0_8_;
            pRVar23->user = (RTCRayQueryContext *)auVar51._8_8_;
            *(undefined1 (*) [16])&pRVar23->args = auVar76;
            pRVar23[1].user = (RTCRayQueryContext *)auVar78._0_8_;
            pRVar23[1].args = (RTCIntersectArguments *)auVar78._8_8_;
            pSVar19 = auVar65._0_8_;
            pRVar23 = pRVar23 + 2;
            k = (size_t)pRVar23;
          }
        }
      }
    }
    k = (size_t)context;
    (**(code **)((long)local_1088->leafIntersector +
                (ulong)*(byte *)((ulong)pSVar19 & 0xfffffffffffffff0) * 0x40 + 0x10))
              (local_1078,ray,sVar24);
    iVar40 = *(int *)(local_1070 + local_1080 * 4 + 0x80);
    ray = local_1070;
    sVar24 = local_1080;
    iVar41 = iVar40;
    iVar42 = iVar40;
    iVar43 = iVar40;
    fVar87 = local_1038;
    fVar88 = fStack_1034;
    fVar89 = fStack_1030;
    fVar90 = fStack_102c;
    fVar69 = local_1048;
    fVar37 = fStack_1044;
    fVar95 = fStack_1040;
    fVar70 = fStack_103c;
    fVar38 = local_1058;
    fVar96 = fStack_1054;
    fVar71 = fStack_1050;
    fVar39 = fStack_104c;
    fVar48 = local_1028;
    fVar49 = fStack_1024;
    fVar56 = fStack_1020;
    fVar57 = fStack_101c;
    fVar58 = local_10a8;
    fVar59 = fStack_10a4;
    fVar60 = fStack_10a0;
    fVar61 = fStack_109c;
    fVar82 = local_1098;
    fVar83 = fStack_1094;
    fVar84 = fStack_1090;
    fVar85 = fStack_108c;
    iVar98 = local_1068;
    iVar100 = iStack_1064;
    iVar102 = iStack_1060;
    iVar104 = iStack_105c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }